

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_zipx_bzip2(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  zip *zip;
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  wchar_t wVar5;
  uchar *puVar6;
  char *pcVar7;
  ssize_t sVar8;
  ulong request;
  ssize_t bytes_avail;
  ssize_t local_38;
  
  zip = (zip *)a->format->data;
  local_38 = 0;
  if (zip->decompress_init == '\0') {
    if (zip->bzstream_valid != '\0') {
      BZ2_bzDecompressEnd(&zip->bzstream);
      zip->bzstream_valid = '\0';
    }
    (zip->bzstream).bzfree = (_func_void_void_ptr_void_ptr *)0x0;
    (zip->bzstream).opaque = (void *)0x0;
    (zip->bzstream).state = (void *)0x0;
    (zip->bzstream).bzalloc = (_func_void_ptr_void_ptr_int_int *)0x0;
    (zip->bzstream).avail_out = 0;
    (zip->bzstream).total_out_lo32 = 0;
    *(undefined8 *)&(zip->bzstream).total_out_hi32 = 0;
    *(undefined8 *)&(zip->bzstream).total_in_hi32 = 0;
    (zip->bzstream).next_out = (char *)0x0;
    (zip->bzstream).next_in = (char *)0x0;
    (zip->bzstream).avail_in = 0;
    (zip->bzstream).total_in_lo32 = 0;
    uVar3 = BZ2_bzDecompressInit(&zip->bzstream,0,1);
    if (uVar3 == 0) {
      zip->bzstream_valid = '\x01';
      free(zip->uncompressed_buffer);
      zip->uncompressed_buffer_size = 0x40000;
      puVar6 = (uchar *)malloc(0x40000);
      zip->uncompressed_buffer = puVar6;
      if (puVar6 == (uchar *)0x0) {
        bVar2 = false;
        archive_set_error(&a->archive,0xc,"No memory for bzip2 decompression");
        wVar5 = L'\xffffffe2';
      }
      else {
        zip->decompress_init = '\x01';
        wVar5 = L'\0';
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
      archive_set_error(&a->archive,-1,"bzip2 initialization failed(%d)",(ulong)uVar3);
      wVar5 = L'\xffffffe7';
    }
    if (!bVar2) {
      return wVar5;
    }
  }
  pcVar7 = (char *)__archive_read_ahead(a,1,&local_38);
  if (-1 < local_38) {
    sVar8 = local_38;
    if (zip->entry_bytes_remaining < local_38) {
      sVar8 = zip->entry_bytes_remaining;
    }
    if (0 < sVar8) {
      (zip->bzstream).next_in = pcVar7;
      (zip->bzstream).avail_in = (uint)sVar8;
      (zip->bzstream).total_in_lo32 = 0;
      (zip->bzstream).total_in_hi32 = 0;
      (zip->bzstream).next_out = (char *)zip->uncompressed_buffer;
      (zip->bzstream).avail_out = (uint)zip->uncompressed_buffer_size;
      (zip->bzstream).total_out_lo32 = 0;
      (zip->bzstream).total_out_hi32 = 0;
      iVar4 = BZ2_bzDecompress(&zip->bzstream);
      if (iVar4 == 0) {
LAB_00643508:
        request = (ulong)(zip->bzstream).total_in_lo32;
        __archive_read_consume(a,request);
        sVar1 = *(size_t *)&(zip->bzstream).total_out_lo32;
        zip->entry_bytes_remaining = zip->entry_bytes_remaining - request;
        zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + request;
        zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + sVar1;
        *size = sVar1;
        *buff = zip->uncompressed_buffer;
        wVar5 = consume_optional_marker(a,zip);
        return wVar5;
      }
      if (iVar4 == 4) {
        iVar4 = BZ2_bzDecompressEnd(&zip->bzstream);
        if (iVar4 == 0) {
          zip->end_of_entry = '\x01';
          goto LAB_00643508;
        }
        pcVar7 = "Failed to clean up bzip2 decompressor";
      }
      else {
        pcVar7 = "bzip2 decompression failed";
      }
      iVar4 = -1;
      goto LAB_006434e5;
    }
  }
  pcVar7 = "Truncated bzip2 file body";
  iVar4 = 0x54;
LAB_006434e5:
  archive_set_error(&a->archive,iVar4,pcVar7);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_zipx_bzip2(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip = (struct zip *)(a->format->data);
	ssize_t bytes_avail = 0, in_bytes, to_consume;
	const void *compressed_buff;
	int r;
	uint64_t total_out;

	(void) offset; /* UNUSED */

	/* Initialize decompression context if we're here for the first time. */
	if(!zip->decompress_init) {
		r = zipx_bzip2_init(a, zip);
		if(r != ARCHIVE_OK)
			return r;
	}

	/* Fetch more compressed bytes. */
	compressed_buff = __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated bzip2 file body");
		return (ARCHIVE_FATAL);
	}

	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);
	if(in_bytes < 1) {
		/* libbz2 doesn't complain when caller feeds avail_in == 0.
		 * It will actually return success in this case, which is
		 * undesirable. This is why we need to make this check
		 * manually. */

		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated bzip2 file body");
		return (ARCHIVE_FATAL);
	}

	/* Setup buffer boundaries. */
	zip->bzstream.next_in = (char*)(uintptr_t) compressed_buff;
	zip->bzstream.avail_in = (uint32_t)in_bytes;
	zip->bzstream.total_in_hi32 = 0;
	zip->bzstream.total_in_lo32 = 0;
	zip->bzstream.next_out = (char*) zip->uncompressed_buffer;
	zip->bzstream.avail_out = (uint32_t)zip->uncompressed_buffer_size;
	zip->bzstream.total_out_hi32 = 0;
	zip->bzstream.total_out_lo32 = 0;

	/* Perform the decompression. */
	r = BZ2_bzDecompress(&zip->bzstream);
	switch(r) {
		case BZ_STREAM_END:
			/* If we're at the end of the stream, deinitialize the
			 * decompression context now. */
			switch(BZ2_bzDecompressEnd(&zip->bzstream)) {
				case BZ_OK:
					break;
				default:
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to clean up bzip2 "
					    "decompressor");
					return ARCHIVE_FATAL;
			}

			zip->end_of_entry = 1;
			break;
		case BZ_OK:
			/* The decompressor has successfully decoded this
			 * chunk of data, but more data is still in queue. */
			break;
		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "bzip2 decompression failed");
			return ARCHIVE_FATAL;
	}

	/* Update the pointers so decompressor can continue decoding. */
	to_consume = zip->bzstream.total_in_lo32;
	__archive_read_consume(a, to_consume);

	total_out = ((uint64_t) zip->bzstream.total_out_hi32 << 32) |
	    zip->bzstream.total_out_lo32;

	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += total_out;

	/* Give libarchive its due. */
	*size = total_out;
	*buff = zip->uncompressed_buffer;

	/* Seek for optional marker, like in other entries. */
	r = consume_optional_marker(a, zip);
	if(r != ARCHIVE_OK)
		return r;

	return ARCHIVE_OK;
}